

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O3

void __thiscall
SortByPTypeProcessTest_SortByPTypeStep_Test::~SortByPTypeProcessTest_SortByPTypeStep_Test
          (SortByPTypeProcessTest_SortByPTypeStep_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(SortByPTypeProcessTest, SortByPTypeStep) {
    ScenePreprocessor s(mScene);
    s.ProcessScene();
    for (unsigned int m = 0; m< 10;++m)
        EXPECT_EQ(result[m], mScene->mMeshes[m]->mPrimitiveTypes);

    mProcess1->Execute(mScene);

    unsigned int idx = 0;
    for (unsigned int m = 0,real = 0; m< 10;++m) {
        for (unsigned int n = 0; n < 4;++n) {
            if ((idx = num[m][n])) {
                EXPECT_TRUE(real < mScene->mNumMeshes);

                aiMesh* mesh = mScene->mMeshes[real];

                EXPECT_TRUE(NULL != mesh);
                EXPECT_EQ(AI_PRIMITIVE_TYPE_FOR_N_INDICES(n+1), mesh->mPrimitiveTypes);
                EXPECT_TRUE(NULL != mesh->mVertices);
                EXPECT_TRUE(NULL != mesh->mNormals);
                EXPECT_TRUE(NULL != mesh->mTangents);
                EXPECT_TRUE(NULL != mesh->mBitangents);
                EXPECT_TRUE(NULL != mesh->mTextureCoords[0]);

                EXPECT_TRUE(mesh->mNumFaces == idx);
                for (unsigned int f = 0; f < mesh->mNumFaces;++f) {
                    aiFace& face = mesh->mFaces[f];
                    EXPECT_TRUE(face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3));
                }
                ++real;
            }
        }
    }
}